

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeWindows(ImVector<ImGuiWindow_*> *windows,char *label)

{
  bool bVar1;
  char *in_RSI;
  ImVector<ImGuiWindow_*> *in_RDI;
  int i;
  char *in_stack_00000090;
  ImGuiWindow *in_stack_00000098;
  int local_14;
  
  bVar1 = TreeNode(in_RSI,"%s (%d)",in_RSI,(ulong)(uint)in_RDI->Size);
  if (bVar1) {
    for (local_14 = 0; local_14 < in_RDI->Size; local_14 = local_14 + 1) {
      ImVector<ImGuiWindow_*>::operator[](in_RDI,local_14);
      NodeWindow(in_stack_00000098,in_stack_00000090);
    }
    TreePop();
  }
  return;
}

Assistant:

static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
                Funcs::NodeWindow(windows[i], "Window");
            ImGui::TreePop();
        }